

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::handleSkipPch(cmQtAutoGenInitializer *this,cmSourceFile *sf)

{
  _Hash_node_base this_00;
  bool bVar1;
  cmValue cVar2;
  bool bVar3;
  __node_base *p_Var4;
  allocator<char> local_51;
  string local_50;
  
  p_Var4 = &(this->AutogenTarget).Sources._M_h._M_before_begin;
  bVar3 = true;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    bVar1 = cmSourceFile::GetIsGenerated((cmSourceFile *)p_Var4[1]._M_nxt,GlobalAndLocal);
    if (!bVar1) {
      this_00._M_nxt = p_Var4[1]._M_nxt;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"SKIP_PRECOMPILE_HEADERS",&local_51);
      cVar2 = cmSourceFile::GetProperty((cmSourceFile *)this_00._M_nxt,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = (bool)(bVar3 & cVar2.Value != (string *)0x0);
    }
  }
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"SKIP_PRECOMPILE_HEADERS",&local_51);
    cmSourceFile::SetProperty(sf,&local_50,"ON");
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::handleSkipPch(cmSourceFile* sf)
{
  bool skipPch = true;
  for (auto const& pair : this->AutogenTarget.Sources) {
    if (!pair.first->GetIsGenerated() &&
        !pair.first->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
      skipPch = false;
    }
  }

  if (skipPch) {
    sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
  }
}